

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseActionCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Result RVar2;
  Command *pCVar3;
  Enum EVar4;
  
  pCVar3 = (Command *)operator_new(0x18);
  pCVar3->_vptr_Command = (_func_int **)0x0;
  *(undefined8 *)&pCVar3->type = 0;
  pCVar3->type = Action;
  pCVar3->_vptr_Command = (_func_int **)&PTR__ActionCommandBase_015473c8;
  pCVar3[1]._vptr_Command = (_func_int **)0x0;
  RVar2 = ParseAction(this,(ActionPtr *)(pCVar3 + 1));
  if (RVar2.enum_ == Error) {
    (*pCVar3->_vptr_Command[1])(pCVar3);
    EVar4 = Error;
  }
  else {
    pCVar1 = (out_command->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar3;
    EVar4 = Ok;
    if (pCVar1 != (Command *)0x0) {
      (*pCVar1->_vptr_Command[1])();
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseActionCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseActionCommand);
  auto command = MakeUnique<ActionCommand>();
  CHECK_RESULT(ParseAction(&command->action));
  *out_command = std::move(command);
  return Result::Ok;
}